

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint llvm::dwarf::FormVersion(Form Form)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((ushort)(Form - DW_FORM_addr) < 0x2c) {
    uVar1 = *(uint *)(&DAT_00e6f610 + (ulong)(ushort)(Form - DW_FORM_addr) * 4);
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::FormVersion(dwarf::Form Form) {
  switch (Form) {
  default:
    return 0;
#define HANDLE_DW_FORM(ID, NAME, VERSION, VENDOR)                              \
  case DW_FORM_##NAME:                                                         \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}